

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# double_cast_operator.hpp
# Opt level: O2

bool duckdb::TryDoubleCast<double>
               (char *buf,idx_t len,double *result,bool strict,char decimal_separator)

{
  byte bVar1;
  char *first;
  byte *pbVar2;
  ulong uVar3;
  long lVar4;
  byte *last;
  from_chars_result fVar5;
  
  uVar3 = 0;
  while( true ) {
    lVar4 = len - uVar3;
    if (lVar4 == 0) {
      return false;
    }
    bVar1 = buf[uVar3];
    if ((4 < bVar1 - 9) && (bVar1 != 0x20)) break;
    uVar3 = uVar3 + 1;
  }
  if (bVar1 == 0x2b) {
    if (strict) {
      return false;
    }
    first = buf + uVar3 + 1;
    lVar4 = ~uVar3 + len;
  }
  else {
    first = buf + uVar3;
    if (((len - 1 != uVar3 && strict) && bVar1 == 0x30) && ((byte)(buf[uVar3 + 1] - 0x30U) < 10)) {
      return false;
    }
  }
  last = (byte *)(first + lVar4);
  fVar5 = duckdb_fast_float::from_chars<double>
                    (first,(char *)last,result,strict,decimal_separator,general);
  pbVar2 = (byte *)fVar5.ptr;
  if (fVar5.ec != 0) {
    return false;
  }
  if (!strict) {
    while (((pbVar2 < last && ((ulong)*pbVar2 < 0x21)) &&
           ((0x100003e00U >> ((ulong)*pbVar2 & 0x3f) & 1) != 0))) {
      pbVar2 = pbVar2 + 1;
    }
  }
  return pbVar2 == last;
}

Assistant:

static bool TryDoubleCast(const char *buf, idx_t len, T &result, bool strict, char decimal_separator = '.') {
	// skip any spaces at the start
	while (len > 0 && StringUtil::CharacterIsSpace(*buf)) {
		buf++;
		len--;
	}
	if (len == 0) {
		return false;
	}
	if (*buf == '+') {
		if (strict) {
			// plus is not allowed in strict mode
			return false;
		}
		buf++;
		len--;
	}
	if (strict && len >= 2) {
		if (buf[0] == '0' && StringUtil::CharacterIsDigit(buf[1])) {
			// leading zeros are not allowed in strict mode
			return false;
		}
	}
	auto endptr = buf + len;
	auto parse_result = duckdb_fast_float::from_chars(buf, buf + len, result, strict, decimal_separator);
	if (parse_result.ec != std::errc()) {
		return false;
	}
	auto current_end = parse_result.ptr;
	if (!strict) {
		while (current_end < endptr && StringUtil::CharacterIsSpace(*current_end)) {
			current_end++;
		}
	}
	return current_end == endptr;
}